

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

partial_ordering __thiscall phosg::JSON::operator<=>(JSON *this,list_type *v)

{
  bool bVar1;
  unsigned_long *puVar2;
  const_reference pvVar3;
  type this_00;
  type other;
  size_type sVar4;
  size_type sVar5;
  type local_71;
  type local_59;
  strong_ordering local_4b;
  __unspec local_4a;
  type local_49;
  ulong local_48;
  size_t z;
  size_type local_38;
  ulong local_30;
  size_t max_size;
  list_type *stored_v;
  list_type *v_local;
  JSON *this_local;
  partial_ordering item_ret;
  
  stored_v = v;
  v_local = (list_type *)this;
  max_size = (size_t)::std::
                     get_if<5ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                               (&this->value);
  if ((add_pointer_t<const_variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
       )max_size ==
      (add_pointer_t<const_variant_alternative_t<5UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
       )0x0) {
    this_local._7_1_ = '\x02';
  }
  else {
    local_38 = ::std::
               vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
               ::size((vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                       *)max_size);
    z = ::std::
        vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
        ::size(stored_v);
    puVar2 = std::min<unsigned_long>(&local_38,&z);
    local_30 = *puVar2;
    for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
      pvVar3 = ::std::
               vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
               ::operator[]((vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                             *)max_size,local_48);
      this_00 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*(pvVar3)
      ;
      pvVar3 = ::std::
               vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
               ::operator[](stored_v,local_48);
      other = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*(pvVar3);
      local_49 = (type)operator<=>(this_00,other);
      this_local._7_1_ = (partial_ordering)local_49;
      std::__cmp_cat::__unspec::__unspec(&local_4a,(__unspec *)0x0);
      bVar1 = ::std::operator==(local_49);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (partial_ordering)this_local._7_1_;
      }
    }
    sVar4 = ::std::
            vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
            ::size((vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                    *)max_size);
    sVar5 = ::std::
            vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
            ::size(stored_v);
    local_59 = -1;
    if (sVar5 <= sVar4) {
      local_59 = '\x01';
    }
    local_71 = '\0';
    if (sVar4 != sVar5) {
      local_71 = local_59;
    }
    local_4b._M_value = local_71;
    this_local._7_1_ = ::std::strong_ordering::operator_cast_to_partial_ordering(&local_4b);
  }
  return (partial_ordering)this_local._7_1_;
}

Assistant:

partial_ordering JSON::operator<=>(const list_type& v) const {
  const list_type* stored_v = get_if<5>(&this->value);
  if (stored_v == nullptr) {
    return partial_ordering::unordered;
  }
  // Note: We don't use vector::operator<=> here because the items are pointers,
  // and we want to compare the pointed-to objects instead.
  size_t max_size = min<size_t>(stored_v->size(), v.size());
  for (size_t z = 0; z < max_size; z++) {
    partial_ordering item_ret = *(*stored_v)[z] <=> *v[z];
    if (item_ret != 0) {
      return item_ret;
    }
  }
  // If we get here, then all possible items matched. If the sizes aren't equal
  // and stored_v is longer, then stored_v is greater than v; if v is longer,
  // then v is greater than stored_v.
  return stored_v->size() <=> v.size();
}